

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O1

size_t mwFreeUp(size_t needed,int urgent)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  mwData *mw;
  mwData *pmVar4;
  
  uVar1 = mwDrop_(1,0xfc,1);
  mw = mwHead;
  if (uVar1 != 0) {
    return needed;
  }
  while( true ) {
    if (mw == (mwData *)0x0) {
      return 0;
    }
    if ((mw->flag & 1) != 0) break;
    mw = mw->next;
  }
  pmVar4 = mw + 1;
  if (mwDataSize == '\0') {
    pmVar4 = mw;
  }
  iVar2 = (int)mw->size;
  if (iVar2 != 0) {
    lVar3 = 0;
    do {
      if (*(char *)((long)&pmVar4->next + lVar3) != -4) {
        mwErrors = mwErrors + 1;
        iVar2 = mwFlushR();
        mwFlushingB2 = iVar2 + 1;
        mwFlushingB1 = mwFlushingB2;
        mwFlushing = mwFlushingB2;
        mwFlush();
        mwWrite("wild pointer: <%ld> NoMansLand %p alloc\'d at %s(%d)\n",mw->count,&pmVar4->file,
                mw->file,(ulong)(uint)mw->line);
        break;
      }
      lVar3 = lVar3 + 1;
    } while (iVar2 != (int)lVar3);
  }
  mwUnlink(mw,"mwFreeUp",0);
  free(mw);
  return needed;
}

Assistant:

static size_t mwFreeUp(size_t needed, int urgent)
{
	void *p;
	mwData *mw, *mw2;
	char *data;

	/* free grabbed NML memory */
	for (;;) {
		if (mwDrop_(1, MW_VAL_NML, 1) == 0) {
			break;
		}
		p = malloc(needed);
		if (p == NULL) {
			continue;
		}
		free(p);
		return needed;
	}

	/* free normal NML memory */
	mw = mwHead;
	while (mw != NULL) {
		if (!(mw->flag & MW_NML)) {
			mw = mw->next;
		} else {
			data = ((char *)mw) + mwDataSize + mwOverflowZoneSize;
			if (mwTestMem(data, mw->size, MW_VAL_NML)) {
				mwIncErr();
				mwWrite("wild pointer: <%ld> NoMansLand %p alloc'd at %s(%d)\n",
						mw->count, data + mwOverflowZoneSize, mw->file, mw->line);
			}
			mw2 = mw->next;
			mwUnlink(mw, "mwFreeUp", 0);
			free(mw);
			mw = mw2;
			p = malloc(needed);
			if (p == NULL) {
				continue;
			}
			free(p);
			return needed;
		}
	}

	/* if not urgent (for internal purposes), fail */
	if (!urgent) {
		return 0;
	}

	/* free grabbed memory */
	for (;;) {
		if (mwDrop_(1, MW_VAL_GRB, 1) == 0) {
			break;
		}
		p = malloc(needed);
		if (p == NULL) {
			continue;
		}
		free(p);
		return needed;
	}

	return 0;
}